

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O1

void absl::lts_20240722::synchronization_internal::Sort
               (Vec<absl::lts_20240722::synchronization_internal::(anonymous_namespace)::Node_*>
                *nodes,Vec<int> *delta)

{
  uint *__last;
  uint uVar1;
  int *__first;
  Node **ppNVar2;
  Node *pNVar3;
  long lVar4;
  ulong uVar5;
  uint *puVar6;
  int *__i;
  uint *__last_00;
  
  uVar1 = delta->size_;
  uVar5 = (ulong)uVar1;
  if (uVar5 != 0) {
    __first = delta->ptr_;
    __last = (uint *)(__first + uVar5);
    lVar4 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar1 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_comp_iter<absl::lts_20240722::synchronization_internal::Sort(absl::lts_20240722::synchronization_internal::(anonymous_namespace)::Vec<absl::lts_20240722::synchronization_internal::(anonymous_namespace)::Node*>const&,absl::lts_20240722::synchronization_internal::(anonymous_namespace)::Vec<int>*)::ByRank>>
              (__first,(int *)__last,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<ByRank>)nodes);
    if (uVar1 < 0x11) {
      std::
      __insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<absl::lts_20240722::synchronization_internal::Sort(absl::lts_20240722::synchronization_internal::(anonymous_namespace)::Vec<absl::lts_20240722::synchronization_internal::(anonymous_namespace)::Node*>const&,absl::lts_20240722::synchronization_internal::(anonymous_namespace)::Vec<int>*)::ByRank>>
                (__first,(int *)__last,(_Iter_comp_iter<ByRank>)nodes);
      return;
    }
    __last_00 = (uint *)(__first + 0x10);
    std::
    __insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<absl::lts_20240722::synchronization_internal::Sort(absl::lts_20240722::synchronization_internal::(anonymous_namespace)::Vec<absl::lts_20240722::synchronization_internal::(anonymous_namespace)::Node*>const&,absl::lts_20240722::synchronization_internal::(anonymous_namespace)::Vec<int>*)::ByRank>>
              (__first,(int *)__last_00,(_Iter_comp_iter<ByRank>)nodes);
    ppNVar2 = nodes->ptr_;
    do {
      uVar5 = (ulong)__last_00[-1];
      uVar1 = *__last_00;
      pNVar3 = ppNVar2[uVar1];
      puVar6 = __last_00;
      if (pNVar3->rank < ppNVar2[uVar5]->rank) {
        do {
          *puVar6 = (uint)uVar5;
          uVar5 = (ulong)puVar6[-2];
          puVar6 = puVar6 + -1;
        } while (pNVar3->rank < ppNVar2[uVar5]->rank);
      }
      *puVar6 = uVar1;
      __last_00 = __last_00 + 1;
    } while (__last_00 != __last);
  }
  return;
}

Assistant:

T* end() { return ptr_ + size_; }